

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeRefIsNull(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  Type type_00;
  Expression *value;
  RefIsNull *pRVar2;
  BasicType local_1c;
  TranslateToFuzzReader *local_18;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  local_1c = i32;
  local_18 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  bVar1 = Type::operator==((Type *)&this_local,&local_1c);
  if (!bVar1) {
    __assert_fail("type == Type::i32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x1296,"Expression *wasm::TranslateToFuzzReader::makeRefIsNull(Type)");
  }
  bVar1 = FeatureSet::hasReferenceTypes(&this->wasm->features);
  if (!bVar1) {
    __assert_fail("wasm.features.hasReferenceTypes()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x1297,"Expression *wasm::TranslateToFuzzReader::makeRefIsNull(Type)");
  }
  type_00 = getReferenceType(this);
  value = make(this,type_00);
  pRVar2 = Builder::makeRefIsNull(&this->builder,value);
  return (Expression *)pRVar2;
}

Assistant:

Expression* TranslateToFuzzReader::makeRefIsNull(Type type) {
  assert(type == Type::i32);
  assert(wasm.features.hasReferenceTypes());
  return builder.makeRefIsNull(make(getReferenceType()));
}